

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O1

pair<unsigned_long,_bool> __thiscall
cmComputeLinkDepends::AddLinkEntry(cmComputeLinkDepends *this,cmLinkItem *item,size_t groupIndex)

{
  iterator *piVar1;
  _Base_ptr p_Var2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  char *pcVar4;
  _Elt_pointer pBVar5;
  size_type sVar6;
  bool bVar7;
  element_type *peVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  int iVar10;
  string *psVar11;
  cmValue cVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ulong uVar13;
  pointer this_01;
  bool bVar14;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  basic_string_view<char,_std::char_traits<char>_> __str;
  pair<std::_Rb_tree_iterator<std::pair<const_cmLinkItem,_unsigned_long>_>,_bool> pVar15;
  pair<unsigned_long,_bool> pVar16;
  BFSEntry qe;
  string var;
  BFSEntry local_c8;
  undefined8 uStack_b0;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  size_t local_98;
  char **local_90;
  size_t local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  undefined8 uStack_78;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  pVar15 = AllocateLinkEntry(this,item);
  p_Var2 = pVar15.first._M_node._M_node[4]._M_parent;
  if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    uVar13 = 0;
  }
  else {
    this_01 = (this->EntryList).
              super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
              ._M_impl.super__Vector_impl_data._M_start + (long)p_Var2;
    local_98 = groupIndex;
    psVar11 = cmLinkItem::AsStr_abi_cxx11_(item);
    pcVar3 = (psVar11->_M_dataplus)._M_p;
    local_90 = (char **)&local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar3,pcVar3 + psVar11->_M_string_length);
    local_a8 = (item->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
               .
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    p_Stack_a0 = (item->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                 TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
    if (p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Stack_a0->_M_use_count = p_Stack_a0->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Stack_a0->_M_use_count = p_Stack_a0->_M_use_count + 1;
      }
    }
    if (local_90 == (char **)&local_80) {
      uStack_b0 = uStack_78;
      local_c8.Index = (size_t)&local_c8.LibDepends;
    }
    else {
      local_c8.Index = (size_t)local_90;
    }
    local_c8.LibDepends = (char *)CONCAT71(uStack_7f,local_80);
    local_c8.GroupIndex = local_88;
    local_88 = 0;
    local_80 = 0;
    local_90 = (char **)&local_80;
    std::__cxx11::string::operator=((string *)this_01,(string *)&local_c8);
    p_Var9 = p_Stack_a0;
    peVar8 = local_a8;
    local_a8 = (element_type *)0x0;
    p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
              ((long)&(this_01->Item).Backtrace.
                      super_cmConstStack<cmListFileContext,_cmListFileBacktrace> + 8))->_M_pi;
    (this_01->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar8;
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(this_01->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace> + 8
    ))->_M_pi = p_Var9;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
    }
    if ((char **)local_c8.Index != &local_c8.LibDepends) {
      operator_delete((void *)local_c8.Index,(ulong)(local_c8.LibDepends + 1));
    }
    if (local_90 != (char **)&local_80) {
      operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
    }
    this_01->Target = item->Target;
    psVar11 = &this_01->Feature;
    std::__cxx11::string::_M_assign((string *)psVar11);
    if (((this_01->Target == (cmGeneratorTarget *)0x0) &&
        (pcVar4 = (this_01->Item).Value._M_dataplus._M_p, *pcVar4 == '-')) && (pcVar4[1] != 'l')) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)this_01);
      iVar10 = std::__cxx11::string::compare((char *)local_50);
      bVar14 = iVar10 != 0;
      bVar7 = true;
    }
    else {
      bVar7 = false;
      bVar14 = false;
    }
    if ((bVar7) && (local_50[0] != local_40)) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if (bVar14) {
      this_01->Kind = Flag;
      std::__cxx11::string::_M_assign((string *)psVar11);
    }
    else {
      local_c8.GroupIndex = *(size_t *)&(this_01->Item).Value._M_dataplus;
      local_c8.Index = (this_01->Item).Value._M_string_length;
      __str._M_str = DAT_00a50708;
      __str._M_len = (anonymous_namespace)::LG_BEGIN;
      iVar10 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                         ((basic_string_view<char,_std::char_traits<char>_> *)&local_c8,0,
                          (anonymous_namespace)::LG_BEGIN,__str);
      if (((iVar10 == 0) && (sVar6 = (this_01->Item).Value._M_string_length, sVar6 != 0)) &&
         (*(char *)(*(long *)&(this_01->Item).Value._M_dataplus + -1 + sVar6) == '>')) {
        this_01->Kind = Group;
      }
    }
    uVar13 = CONCAT71((int7)((ulong)psVar11 >> 8),1);
    if (this_01->Kind != Group) {
      if (this_01->Target == (cmGeneratorTarget *)0x0) {
        local_c8.GroupIndex = *(size_t *)&(this_01->Item).Value._M_dataplus;
        local_c8.Index = (this_01->Item).Value._M_string_length;
        local_c8.LibDepends = (pointer)0x0;
        uStack_b0 = 0xc;
        local_a8 = (element_type *)0x7c505e;
        p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        views._M_len = 2;
        views._M_array = (iterator)&local_c8;
        cmCatViews(&local_70,views);
        cVar12 = cmMakefile::GetDefinition(this->Makefile,&local_70);
        if (cVar12.Value == (string *)0x0) {
          if (this_01->Kind != Flag) {
            (this->InferredDependSets).
            super__Vector_base<cmComputeLinkDepends::DependSetList,_std::allocator<cmComputeLinkDepends::DependSetList>_>
            ._M_impl.super__Vector_impl_data._M_start[(long)p_Var2].Initialized = true;
          }
        }
        else {
          local_c8.GroupIndex = local_98;
          local_c8.LibDepends = ((cVar12.Value)->_M_dataplus)._M_p;
          pBVar5 = (this->BFSQueue).c.
                   super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (pBVar5 == (this->BFSQueue).c.
                        super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            local_c8.Index = (size_t)p_Var2;
            std::
            deque<cmComputeLinkDepends::BFSEntry,std::allocator<cmComputeLinkDepends::BFSEntry>>::
            _M_push_back_aux<cmComputeLinkDepends::BFSEntry_const&>
                      ((deque<cmComputeLinkDepends::BFSEntry,std::allocator<cmComputeLinkDepends::BFSEntry>>
                        *)&this->BFSQueue,&local_c8);
          }
          else {
            pBVar5->LibDepends = local_c8.LibDepends;
            pBVar5->Index = (size_t)p_Var2;
            pBVar5->GroupIndex = local_98;
            piVar1 = &(this->BFSQueue).c.
                      super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                      ._M_impl.super__Deque_impl_data._M_finish;
            piVar1->_M_cur = piVar1->_M_cur + 1;
            local_c8.Index = (size_t)p_Var2;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        local_c8.GroupIndex = local_98;
        local_c8.LibDepends = (char *)0x0;
        pBVar5 = (this->BFSQueue).c.
                 super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pBVar5 == (this->BFSQueue).c.
                      super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          local_c8.Index = (size_t)p_Var2;
          std::deque<cmComputeLinkDepends::BFSEntry,std::allocator<cmComputeLinkDepends::BFSEntry>>
          ::_M_push_back_aux<cmComputeLinkDepends::BFSEntry_const&>
                    ((deque<cmComputeLinkDepends::BFSEntry,std::allocator<cmComputeLinkDepends::BFSEntry>>
                      *)&this->BFSQueue,&local_c8);
        }
        else {
          pBVar5->LibDepends = (char *)0x0;
          pBVar5->Index = (size_t)p_Var2;
          pBVar5->GroupIndex = local_98;
          piVar1 = &(this->BFSQueue).c.
                    super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                    ._M_impl.super__Deque_impl_data._M_finish;
          piVar1->_M_cur = piVar1->_M_cur + 1;
        }
      }
    }
  }
  pVar16._8_8_ = uVar13 & 0xffffffff;
  pVar16.first = (unsigned_long)p_Var2;
  return pVar16;
}

Assistant:

std::pair<size_t, bool> cmComputeLinkDepends::AddLinkEntry(
  cmLinkItem const& item, size_t groupIndex)
{
  // Allocate a spot for the item entry.
  auto lei = this->AllocateLinkEntry(item);

  // Check if the item entry has already been added.
  if (!lei.second) {
    // Yes.  We do not need to follow the item's dependencies again.
    return { lei.first->second, false };
  }

  // Initialize the item entry.
  size_t index = lei.first->second;
  LinkEntry& entry = this->EntryList[index];
  entry.Item = BT<std::string>(item.AsStr(), item.Backtrace);
  entry.Target = item.Target;
  entry.Feature = item.Feature;
  if (!entry.Target && entry.Item.Value[0] == '-' &&
      entry.Item.Value[1] != 'l' &&
      entry.Item.Value.substr(0, 10) != "-framework") {
    entry.Kind = LinkEntry::Flag;
    entry.Feature = LinkEntry::DEFAULT;
  } else if (cmHasPrefix(entry.Item.Value, LG_BEGIN) &&
             cmHasSuffix(entry.Item.Value, '>')) {
    entry.Kind = LinkEntry::Group;
  }

  if (entry.Kind != LinkEntry::Group) {
    // If the item has dependencies queue it to follow them.
    if (entry.Target) {
      // Target dependencies are always known.  Follow them.
      BFSEntry qe = { index, groupIndex, nullptr };
      this->BFSQueue.push(qe);
    } else {
      // Look for an old-style <item>_LIB_DEPENDS variable.
      std::string var = cmStrCat(entry.Item.Value, "_LIB_DEPENDS");
      if (cmValue val = this->Makefile->GetDefinition(var)) {
        // The item dependencies are known.  Follow them.
        BFSEntry qe = { index, groupIndex, val->c_str() };
        this->BFSQueue.push(qe);
      } else if (entry.Kind != LinkEntry::Flag) {
        // The item dependencies are not known.  We need to infer them.
        this->InferredDependSets[index].Initialized = true;
      }
    }
  }

  return { index, true };
}